

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O2

void tommy_tree_foreach_node(tommy_tree_node *root,tommy_foreach_func *func)

{
  long lVar1;
  tommy_node_struct *ptVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  while (root != (tommy_tree_node *)0x0) {
    tommy_tree_foreach_node(root->prev,func);
    ptVar2 = root->next;
    (*func)(root->data);
    root = ptVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void tommy_tree_foreach_node(tommy_tree_node* root, tommy_foreach_func* func)
{
	tommy_tree_node* next;

	if (!root)
		return;

	tommy_tree_foreach_node(root->prev, func);

	/* make a copy in case func is free() */
	next = root->next;

	func(root->data);

	tommy_tree_foreach_node(next, func);
}